

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

int __thiscall kj::_::PromiseNode::OnReadyEvent::init(OnReadyEvent *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  int extraout_EAX;
  
  if (this->event == (Event *)0x1) {
    if (ctx != (EVP_PKEY_CTX *)0x0) {
      Event::armBreadthFirst((Event *)ctx);
      return extraout_EAX;
    }
  }
  else {
    this->event = (Event *)ctx;
  }
  return in_EAX;
}

Assistant:

void PromiseNode::OnReadyEvent::init(Event* newEvent) {
  if (event == _kJ_ALREADY_READY) {
    // A new continuation was added to a promise that was already ready.  In this case, we schedule
    // breadth-first, to make it difficult for applications to accidentally starve the event loop
    // by repeatedly waiting on immediate promises.
    if (newEvent) newEvent->armBreadthFirst();
  } else {
    event = newEvent;
  }
}